

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O2

void Abc_SclWriteSurfaceText(FILE *s,SC_Surface *p)

{
  Vec_Flt_t *p_00;
  char *pcVar1;
  int iVar2;
  int i;
  float fVar3;
  
  fwrite("          index_1(\"",0x13,1,(FILE *)s);
  for (iVar2 = 0; iVar2 < (p->vIndex0).nSize; iVar2 = iVar2 + 1) {
    fVar3 = Vec_FltEntry(&p->vIndex0,iVar2);
    pcVar1 = "    \"%s\", ";
    if (iVar2 == (p->vIndex0).nSize + -1) {
      pcVar1 = "T = %d\t\t";
    }
    fprintf((FILE *)s,"%f%s",(double)fVar3,pcVar1 + 8);
  }
  fwrite("\");\n",4,1,(FILE *)s);
  fwrite("          index_2(\"",0x13,1,(FILE *)s);
  for (iVar2 = 0; iVar2 < (p->vIndex1).nSize; iVar2 = iVar2 + 1) {
    fVar3 = Vec_FltEntry(&p->vIndex1,iVar2);
    pcVar1 = "    \"%s\", ";
    if (iVar2 == (p->vIndex1).nSize + -1) {
      pcVar1 = "T = %d\t\t";
    }
    fprintf((FILE *)s,"%f%s",(double)fVar3,pcVar1 + 8);
  }
  fwrite("\");\n",4,1,(FILE *)s);
  fwrite("          values (\"",0x13,1,(FILE *)s);
  for (iVar2 = 0; iVar2 < (p->vData).nSize; iVar2 = iVar2 + 1) {
    p_00 = (Vec_Flt_t *)Vec_PtrEntry(&p->vData,iVar2);
    for (i = 0; i < p_00->nSize; i = i + 1) {
      fVar3 = Vec_FltEntry(p_00,i);
      pcVar1 = ", ";
      if ((iVar2 == (p->vData).nSize + -1) && (pcVar1 = ", ", i == p_00->nSize + -1)) {
        pcVar1 = "\");";
      }
      fprintf((FILE *)s,"%f%s",(double)fVar3,pcVar1);
    }
    if (iVar2 == (p->vData).nSize + -1) {
      fputc(10,(FILE *)s);
    }
    else {
      fwrite("\\\n",2,1,(FILE *)s);
      fwrite("                   ",0x13,1,(FILE *)s);
    }
  }
  return;
}

Assistant:

static void Abc_SclWriteSurfaceText( FILE * s, SC_Surface * p )
{
    Vec_Flt_t * vVec;
    float Entry;
    int i, k;

    fprintf( s, "          index_1(\"" );  
    Vec_FltForEachEntry( &p->vIndex0, Entry, i )
        fprintf( s, "%f%s", Entry, i == Vec_FltSize(&p->vIndex0)-1 ? "":", " );
    fprintf( s, "\");\n" );

    fprintf( s, "          index_2(\"" );  
    Vec_FltForEachEntry( &p->vIndex1, Entry, i )
        fprintf( s, "%f%s", Entry, i == Vec_FltSize(&p->vIndex1)-1 ? "":", " );
    fprintf( s, "\");\n" );

    fprintf( s, "          values (\"" );  
    Vec_PtrForEachEntry( Vec_Flt_t *, &p->vData, vVec, i )
    {
        Vec_FltForEachEntry( vVec, Entry, k )
            fprintf( s, "%f%s", Entry, i == Vec_PtrSize(&p->vData)-1 && k == Vec_FltSize(vVec)-1 ? "\");":", " );
        if ( i == Vec_PtrSize(&p->vData)-1 )
            fprintf( s, "\n" );
        else
        {
            fprintf( s, "\\\n" );
            fprintf( s, "                   " );  
        }
    }
/*
    fprintf( s, "       approximations: \n" );
    fprintf( s, "       " );
    for ( i = 0; i < 3; i++ ) 
        fprintf( s, "%f ", p->approx[0][i] );
    fprintf( s, "\n" );
    fprintf( s, "       " );
    for ( i = 0; i < 4; i++ ) 
        fprintf( s, "%f ", p->approx[1][i] );
    fprintf( s, "\n" );
    fprintf( s, "       " );
    for ( i = 0; i < 6; i++ ) 
        fprintf( s, "%f ", p->approx[2][i] );
    fprintf( s, "\n" );
    fprintf( s, "       \n" );
*/
}